

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_cfdcapi_script.cpp
# Opt level: O0

void __thiscall
cfdcapi_script_TapscriptTreeAddTree1_Test::TestBody(cfdcapi_script_TapscriptTreeAddTree1_Test *this)

{
  bool bVar1;
  undefined1 uVar2;
  undefined1 uVar3;
  undefined1 uVar4;
  char *pcVar5;
  char *in_R9;
  AssertionResult gtest_ar_29;
  AssertionResult gtest_ar_28;
  AssertionResult gtest_ar_27;
  char *str_buffer;
  AssertionResult gtest_ar_26;
  int tmp_ret;
  AssertionResult gtest_ar_25;
  AssertionResult gtest_ar_24;
  char *tree_str;
  AssertionResult gtest_ar_23;
  AssertionResult gtest_ar_22;
  AssertionResult gtest_ar_21;
  AssertionResult gtest_ar_20;
  char *control_block;
  char *leaf_hash;
  char *witness_program;
  AssertionResult gtest_ar_19;
  AssertionResult gtest_ar_18;
  AssertionResult gtest_ar_17;
  AssertionResult gtest_ar_16;
  AssertionResult gtest_ar_15;
  AssertionResult gtest_ar_14;
  AssertionResult gtest_ar_13;
  AssertionResult gtest_ar_12;
  AssertionResult gtest_ar_11;
  AssertionResult gtest_ar_10;
  AssertionResult gtest_ar_9;
  AssertionResult gtest_ar_8;
  AssertionResult gtest_ar_7;
  char *tapscript;
  char *branch_hash;
  uint8_t leaf_version;
  uint8_t depth;
  AssertionResult gtest_ar_6;
  AssertionResult gtest_ar_5;
  uint32_t branch_count;
  AssertionResult gtest_ar_4;
  AssertionResult gtest_ar_3;
  AssertionResult gtest_ar_2;
  AssertionResult gtest_ar_1;
  void *tree_handle;
  AssertionResult gtest_ar_;
  AssertionResult gtest_ar;
  int ret;
  void *handle;
  bool *in_stack_fffffffffffff7e8;
  char **ppcVar6;
  type *ptVar7;
  AssertionResult *in_stack_fffffffffffff7f0;
  int *piVar8;
  CfdErrorCode *in_stack_fffffffffffff7f8;
  char *in_stack_fffffffffffff800;
  AssertionResult *pAVar9;
  undefined7 in_stack_fffffffffffff808;
  undefined1 in_stack_fffffffffffff80f;
  void *in_stack_fffffffffffff828;
  undefined7 in_stack_fffffffffffff880;
  undefined1 in_stack_fffffffffffff887;
  char *in_stack_fffffffffffff888;
  char *in_stack_fffffffffffff8a0;
  AssertionResult *in_stack_fffffffffffff8a8;
  undefined7 in_stack_fffffffffffff8b0;
  undefined1 in_stack_fffffffffffff8b7;
  void *in_stack_fffffffffffff8b8;
  void **in_stack_fffffffffffff8d0;
  void *in_stack_fffffffffffff8d8;
  undefined7 in_stack_fffffffffffff8e0;
  char *in_stack_fffffffffffff8e8;
  undefined8 in_stack_fffffffffffff9c0;
  uint8_t leaf_version_00;
  char *in_stack_fffffffffffff9c8;
  AssertionResult *pAVar10;
  undefined7 in_stack_fffffffffffff9d0;
  undefined1 in_stack_fffffffffffff9d7;
  void *in_stack_fffffffffffff9d8;
  uint8_t in_stack_fffffffffffffa07;
  char *in_stack_fffffffffffffa08;
  void *in_stack_fffffffffffffa10;
  undefined7 in_stack_fffffffffffffa18;
  undefined1 in_stack_fffffffffffffa1f;
  AssertionResult *this_00;
  undefined7 in_stack_fffffffffffffa78;
  char **in_stack_fffffffffffffa80;
  AssertionResult *this_01;
  undefined7 in_stack_fffffffffffffa90;
  char *in_stack_fffffffffffffa98;
  undefined7 in_stack_fffffffffffffab8;
  AssertHelper local_528;
  Message local_520;
  undefined4 local_514;
  AssertionResult local_510;
  AssertHelper local_500;
  Message local_4f8;
  AssertionResult local_4f0;
  AssertHelper local_4e0;
  Message local_4d8;
  undefined4 local_4cc;
  AssertionResult local_4c8;
  char *local_4b8;
  AssertHelper local_4b0;
  Message local_4a8;
  undefined4 local_49c;
  AssertionResult local_498;
  int local_484;
  AssertHelper local_480;
  Message local_478;
  AssertionResult local_470;
  AssertHelper local_460;
  Message local_458;
  undefined4 local_44c;
  AssertionResult local_448;
  char *local_438;
  AssertHelper local_430;
  Message local_428;
  AssertionResult local_420;
  AssertHelper local_410;
  Message local_408;
  AssertionResult local_400;
  AssertHelper local_3f0;
  Message local_3e8;
  AssertionResult local_3e0;
  AssertHelper local_3d0;
  Message local_3c8;
  undefined4 local_3bc;
  AssertionResult local_3b8;
  char *local_3a8;
  char *local_3a0;
  char *local_398;
  AssertHelper local_390;
  Message local_388;
  AssertionResult local_380;
  AssertHelper local_370;
  Message local_368;
  undefined4 local_35c;
  AssertionResult local_358;
  AssertHelper local_348;
  Message local_340;
  undefined4 local_334;
  AssertionResult local_330;
  AssertHelper local_320;
  Message local_318;
  AssertionResult local_310;
  AssertHelper local_300;
  Message local_2f8;
  AssertionResult local_2f0;
  AssertHelper local_2e0;
  Message local_2d8;
  undefined4 local_2cc;
  AssertionResult local_2c8;
  AssertHelper local_2b8;
  Message local_2b0;
  undefined4 local_2a4;
  AssertionResult local_2a0;
  AssertHelper local_290;
  Message local_288;
  undefined4 local_27c;
  AssertionResult local_278;
  AssertHelper local_268;
  Message local_260;
  AssertionResult local_258;
  AssertHelper local_248;
  Message local_240;
  AssertionResult local_238;
  AssertHelper local_228;
  Message local_220;
  undefined4 local_214;
  AssertionResult local_210;
  AssertHelper local_200;
  Message local_1f8;
  undefined4 local_1ec;
  AssertionResult local_1e8;
  AssertHelper local_1d8;
  Message local_1d0;
  undefined4 local_1c4;
  AssertionResult local_1c0;
  char *local_1b0;
  char *local_1a8;
  undefined1 local_19a;
  undefined1 local_199 [9];
  Message local_190;
  undefined4 local_184;
  AssertionResult local_180;
  AssertHelper local_170;
  Message local_168;
  undefined4 local_15c;
  AssertionResult local_158;
  undefined4 local_144;
  AssertHelper local_140;
  Message local_138;
  undefined4 local_12c;
  AssertionResult local_128;
  AssertHelper local_118;
  Message local_110;
  undefined4 local_104;
  AssertionResult local_100;
  AssertHelper local_f0;
  Message local_e8;
  undefined4 local_dc;
  AssertionResult local_d8;
  AssertHelper local_c8;
  Message local_c0;
  undefined4 local_b4;
  AssertionResult local_b0;
  undefined8 local_a0;
  string local_98;
  AssertHelper local_78;
  Message local_70;
  undefined1 local_61;
  AssertionResult local_60;
  AssertHelper local_50;
  Message local_48 [3];
  undefined4 local_2c;
  AssertionResult local_28;
  int local_14;
  long local_10;
  
  leaf_version_00 = (uint8_t)((ulong)in_stack_fffffffffffff9c0 >> 0x38);
  local_10 = 0;
  local_14 = CfdCreateHandle((void **)CONCAT17(in_stack_fffffffffffff80f,in_stack_fffffffffffff808))
  ;
  local_2c = 0;
  testing::internal::EqHelper<false>::Compare<CfdErrorCode,int>
            ((char *)CONCAT17(in_stack_fffffffffffff80f,in_stack_fffffffffffff808),
             in_stack_fffffffffffff800,in_stack_fffffffffffff7f8,(int *)in_stack_fffffffffffff7f0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_28);
  if (!bVar1) {
    testing::Message::Message(local_48);
    pcVar5 = testing::AssertionResult::failure_message((AssertionResult *)0x3acb0a);
    testing::internal::AssertHelper::AssertHelper
              (&local_50,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/capi/test_cfdcapi_script.cpp"
               ,0x1e9,pcVar5);
    testing::internal::AssertHelper::operator=(&local_50,local_48);
    testing::internal::AssertHelper::~AssertHelper(&local_50);
    testing::Message::~Message((Message *)0x3acb6d);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x3acbc2);
  local_61 = local_10 != 0;
  pAVar9 = &local_60;
  testing::AssertionResult::AssertionResult<bool>
            (in_stack_fffffffffffff7f0,in_stack_fffffffffffff7e8,(type *)0x3acbf6);
  uVar2 = testing::AssertionResult::operator_cast_to_bool(pAVar9);
  if (!(bool)uVar2) {
    testing::Message::Message(&local_70);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_98,(internal *)&local_60,(AssertionResult *)"(NULL == handle)","true","false",
               in_R9);
    pcVar5 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_78,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/capi/test_cfdcapi_script.cpp"
               ,0x1ea,pcVar5);
    testing::internal::AssertHelper::operator=(&local_78,&local_70);
    testing::internal::AssertHelper::~AssertHelper(&local_78);
    std::__cxx11::string::~string((string *)&local_98);
    testing::Message::~Message((Message *)0x3accf2);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x3acd6d);
  local_a0 = 0;
  local_14 = CfdInitializeTaprootScriptTree(in_stack_fffffffffffff8d8,in_stack_fffffffffffff8d0);
  local_b4 = 0;
  testing::internal::EqHelper<false>::Compare<CfdErrorCode,int>
            ((char *)CONCAT17(in_stack_fffffffffffff80f,in_stack_fffffffffffff808),
             in_stack_fffffffffffff800,in_stack_fffffffffffff7f8,(int *)in_stack_fffffffffffff7f0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_b0);
  if (!bVar1) {
    testing::Message::Message(&local_c0);
    in_stack_fffffffffffffa98 =
         testing::AssertionResult::failure_message((AssertionResult *)0x3ace42);
    testing::internal::AssertHelper::AssertHelper
              (&local_c8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/capi/test_cfdcapi_script.cpp"
               ,0x1ee,in_stack_fffffffffffffa98);
    testing::internal::AssertHelper::operator=(&local_c8,&local_c0);
    testing::internal::AssertHelper::~AssertHelper(&local_c8);
    testing::Message::~Message((Message *)0x3acea5);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x3acefd);
  if (local_14 == 0) {
    local_14 = CfdSetInitialTapLeaf
                         (in_stack_fffffffffffff9d8,
                          (void *)CONCAT17(in_stack_fffffffffffff9d7,in_stack_fffffffffffff9d0),
                          in_stack_fffffffffffff9c8,leaf_version_00);
    local_dc = 0;
    this_01 = &local_d8;
    testing::internal::EqHelper<false>::Compare<CfdErrorCode,int>
              ((char *)CONCAT17(in_stack_fffffffffffff80f,in_stack_fffffffffffff808),
               in_stack_fffffffffffff800,in_stack_fffffffffffff7f8,(int *)in_stack_fffffffffffff7f0)
    ;
    uVar3 = testing::AssertionResult::operator_cast_to_bool(this_01);
    if (!(bool)uVar3) {
      testing::Message::Message(&local_e8);
      in_stack_fffffffffffffa80 =
           (char **)testing::AssertionResult::failure_message((AssertionResult *)0x3acfe0);
      testing::internal::AssertHelper::AssertHelper
                (&local_f0,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/capi/test_cfdcapi_script.cpp"
                 ,499,(char *)in_stack_fffffffffffffa80);
      testing::internal::AssertHelper::operator=(&local_f0,&local_e8);
      testing::internal::AssertHelper::~AssertHelper(&local_f0);
      testing::Message::~Message((Message *)0x3ad043);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x3ad09b);
    local_14 = CfdAddTapBranchByTapLeaf
                         ((void *)CONCAT17(in_stack_fffffffffffffa1f,in_stack_fffffffffffffa18),
                          in_stack_fffffffffffffa10,in_stack_fffffffffffffa08,
                          in_stack_fffffffffffffa07);
    local_104 = 0;
    this_00 = &local_100;
    testing::internal::EqHelper<false>::Compare<CfdErrorCode,int>
              ((char *)CONCAT17(in_stack_fffffffffffff80f,in_stack_fffffffffffff808),
               in_stack_fffffffffffff800,in_stack_fffffffffffff7f8,(int *)in_stack_fffffffffffff7f0)
    ;
    uVar4 = testing::AssertionResult::operator_cast_to_bool(this_00);
    if (!(bool)uVar4) {
      testing::Message::Message(&local_110);
      pcVar5 = testing::AssertionResult::failure_message((AssertionResult *)0x3ad170);
      testing::internal::AssertHelper::AssertHelper
                (&local_118,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/capi/test_cfdcapi_script.cpp"
                 ,0x1f8,pcVar5);
      testing::internal::AssertHelper::operator=(&local_118,&local_110);
      testing::internal::AssertHelper::~AssertHelper(&local_118);
      testing::Message::~Message((Message *)0x3ad1d3);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x3ad22b);
    local_14 = CfdAddTapBranchByTapLeaf
                         ((void *)CONCAT17(in_stack_fffffffffffffa1f,in_stack_fffffffffffffa18),
                          in_stack_fffffffffffffa10,in_stack_fffffffffffffa08,
                          in_stack_fffffffffffffa07);
    local_12c = 0;
    testing::internal::EqHelper<false>::Compare<CfdErrorCode,int>
              ((char *)CONCAT17(in_stack_fffffffffffff80f,in_stack_fffffffffffff808),
               in_stack_fffffffffffff800,in_stack_fffffffffffff7f8,(int *)in_stack_fffffffffffff7f0)
    ;
    bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_128);
    if (!bVar1) {
      testing::Message::Message(&local_138);
      pcVar5 = testing::AssertionResult::failure_message((AssertionResult *)0x3ad300);
      testing::internal::AssertHelper::AssertHelper
                (&local_140,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/capi/test_cfdcapi_script.cpp"
                 ,0x1fd,pcVar5);
      testing::internal::AssertHelper::operator=(&local_140,&local_138);
      testing::internal::AssertHelper::~AssertHelper(&local_140);
      testing::Message::~Message((Message *)0x3ad363);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x3ad3bb);
    local_144 = 0;
    local_14 = CfdGetTapBranchCount
                         (in_stack_fffffffffffff8b8,
                          (void *)CONCAT17(in_stack_fffffffffffff8b7,in_stack_fffffffffffff8b0),
                          (uint32_t *)in_stack_fffffffffffff8a8);
    local_15c = 0;
    testing::internal::EqHelper<false>::Compare<CfdErrorCode,int>
              ((char *)CONCAT17(in_stack_fffffffffffff80f,in_stack_fffffffffffff808),
               in_stack_fffffffffffff800,in_stack_fffffffffffff7f8,(int *)in_stack_fffffffffffff7f0)
    ;
    bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_158);
    if (!bVar1) {
      testing::Message::Message(&local_168);
      pcVar5 = testing::AssertionResult::failure_message((AssertionResult *)0x3ad497);
      testing::internal::AssertHelper::AssertHelper
                (&local_170,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/capi/test_cfdcapi_script.cpp"
                 ,0x201,pcVar5);
      testing::internal::AssertHelper::operator=(&local_170,&local_168);
      testing::internal::AssertHelper::~AssertHelper(&local_170);
      testing::Message::~Message((Message *)0x3ad4fa);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x3ad54f);
    local_184 = 2;
    testing::internal::EqHelper<false>::Compare<int,unsigned_int>
              ((char *)CONCAT17(in_stack_fffffffffffff80f,in_stack_fffffffffffff808),
               in_stack_fffffffffffff800,in_stack_fffffffffffff7f8,(uint *)in_stack_fffffffffffff7f0
              );
    bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_180);
    if (!bVar1) {
      testing::Message::Message(&local_190);
      pcVar5 = testing::AssertionResult::failure_message((AssertionResult *)0x3ad5fc);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)(local_199 + 1),kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/capi/test_cfdcapi_script.cpp"
                 ,0x202,pcVar5);
      testing::internal::AssertHelper::operator=((AssertHelper *)(local_199 + 1),&local_190);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)(local_199 + 1));
      testing::Message::~Message((Message *)0x3ad65f);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x3ad6b7);
    local_199[0] = false;
    local_19a = 0;
    local_1a8 = (char *)0x0;
    local_1b0 = (char *)0x0;
    piVar8 = (int *)local_199;
    ppcVar6 = &local_1b0;
    local_14 = CfdGetTapBranchData(in_stack_fffffffffffffa98,
                                   (void *)CONCAT17(uVar3,in_stack_fffffffffffffa90),
                                   (uint8_t)((ulong)this_01 >> 0x38),SUB81((ulong)this_01 >> 0x30,0)
                                   ,in_stack_fffffffffffffa80,
                                   (uint8_t *)CONCAT17(uVar4,in_stack_fffffffffffffa78),
                                   (char **)pAVar9,
                                   (uint8_t *)CONCAT17(uVar2,in_stack_fffffffffffffab8));
    local_1c4 = 0;
    pAVar10 = &local_1c0;
    testing::internal::EqHelper<false>::Compare<CfdErrorCode,int>
              ((char *)CONCAT17(in_stack_fffffffffffff80f,in_stack_fffffffffffff808),
               in_stack_fffffffffffff800,in_stack_fffffffffffff7f8,piVar8);
    bVar1 = testing::AssertionResult::operator_cast_to_bool(pAVar10);
    if (!bVar1) {
      testing::Message::Message(&local_1d0);
      pcVar5 = testing::AssertionResult::failure_message((AssertionResult *)0x3ad7d6);
      testing::internal::AssertHelper::AssertHelper
                (&local_1d8,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/capi/test_cfdcapi_script.cpp"
                 ,0x20a,pcVar5);
      testing::internal::AssertHelper::operator=(&local_1d8,&local_1d0);
      testing::internal::AssertHelper::~AssertHelper(&local_1d8);
      testing::Message::~Message((Message *)0x3ad839);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x3ad891);
    if (local_14 == 0) {
      local_1ec = 0;
      testing::internal::EqHelper<true>::Compare<int,unsigned_char>
                ((char *)CONCAT17(in_stack_fffffffffffff80f,in_stack_fffffffffffff808),
                 in_stack_fffffffffffff800,in_stack_fffffffffffff7f8,(uchar *)piVar8,ppcVar6);
      bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_1e8);
      if (!bVar1) {
        testing::Message::Message(&local_1f8);
        pcVar5 = testing::AssertionResult::failure_message((AssertionResult *)0x3ad951);
        testing::internal::AssertHelper::AssertHelper
                  (&local_200,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/capi/test_cfdcapi_script.cpp"
                   ,0x20c,pcVar5);
        testing::internal::AssertHelper::operator=(&local_200,&local_1f8);
        testing::internal::AssertHelper::~AssertHelper(&local_200);
        testing::Message::~Message((Message *)0x3ad9b4);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)0x3ada09);
      local_214 = 0xc0;
      testing::internal::EqHelper<false>::Compare<int,unsigned_char>
                ((char *)CONCAT17(in_stack_fffffffffffff80f,in_stack_fffffffffffff808),
                 in_stack_fffffffffffff800,in_stack_fffffffffffff7f8,(uchar *)piVar8);
      bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_210);
      if (!bVar1) {
        testing::Message::Message(&local_220);
        pcVar5 = testing::AssertionResult::failure_message((AssertionResult *)0x3adab6);
        testing::internal::AssertHelper::AssertHelper
                  (&local_228,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/capi/test_cfdcapi_script.cpp"
                   ,0x20d,pcVar5);
        testing::internal::AssertHelper::operator=(&local_228,&local_220);
        testing::internal::AssertHelper::~AssertHelper(&local_228);
        testing::Message::~Message((Message *)0x3adb19);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)0x3adb6e);
      pAVar10 = &local_238;
      testing::internal::CmpHelperSTREQ
                ((internal *)pAVar10,
                 "\"a85b2107f791b26a84e7586c28cec7cb61202ed3d01944d832500f363782d675\"",
                 "branch_hash","a85b2107f791b26a84e7586c28cec7cb61202ed3d01944d832500f363782d675",
                 local_1a8);
      bVar1 = testing::AssertionResult::operator_cast_to_bool(pAVar10);
      if (!bVar1) {
        testing::Message::Message(&local_240);
        pcVar5 = testing::AssertionResult::failure_message((AssertionResult *)0x3adc0f);
        testing::internal::AssertHelper::AssertHelper
                  (&local_248,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/capi/test_cfdcapi_script.cpp"
                   ,0x210,pcVar5);
        testing::internal::AssertHelper::operator=(&local_248,&local_240);
        testing::internal::AssertHelper::~AssertHelper(&local_248);
        testing::Message::~Message((Message *)0x3adc72);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)0x3adcc7);
      testing::internal::CmpHelperSTREQ((internal *)&local_258,"\"51\"","tapscript","51",local_1b0);
      bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_258);
      if (!bVar1) {
        testing::Message::Message(&local_260);
        pcVar5 = testing::AssertionResult::failure_message((AssertionResult *)0x3add68);
        testing::internal::AssertHelper::AssertHelper
                  (&local_268,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/capi/test_cfdcapi_script.cpp"
                   ,0x213,pcVar5);
        testing::internal::AssertHelper::operator=(&local_268,&local_260);
        testing::internal::AssertHelper::~AssertHelper(&local_268);
        testing::Message::~Message((Message *)0x3addcb);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)0x3ade20);
      CfdFreeStringBuffer((char *)in_stack_fffffffffffff7f8);
      local_1a8 = (char *)0x0;
      CfdFreeStringBuffer((char *)in_stack_fffffffffffff7f8);
      local_1b0 = (char *)0x0;
    }
    piVar8 = (int *)local_199;
    ppcVar6 = &local_1b0;
    local_14 = CfdGetTapBranchData(in_stack_fffffffffffffa98,
                                   (void *)CONCAT17(uVar3,in_stack_fffffffffffffa90),
                                   (uint8_t)((ulong)this_01 >> 0x38),SUB81((ulong)this_01 >> 0x30,0)
                                   ,in_stack_fffffffffffffa80,
                                   (uint8_t *)CONCAT17(uVar4,in_stack_fffffffffffffa78),
                                   (char **)pAVar9,
                                   (uint8_t *)CONCAT17(uVar2,in_stack_fffffffffffffab8));
    local_27c = 0;
    testing::internal::EqHelper<false>::Compare<CfdErrorCode,int>
              ((char *)CONCAT17(in_stack_fffffffffffff80f,in_stack_fffffffffffff808),
               in_stack_fffffffffffff800,in_stack_fffffffffffff7f8,piVar8);
    bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_278);
    if (!bVar1) {
      testing::Message::Message(&local_288);
      pcVar5 = testing::AssertionResult::failure_message((AssertionResult *)0x3adf4e);
      testing::internal::AssertHelper::AssertHelper
                (&local_290,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/capi/test_cfdcapi_script.cpp"
                 ,0x21c,pcVar5);
      testing::internal::AssertHelper::operator=(&local_290,&local_288);
      testing::internal::AssertHelper::~AssertHelper(&local_290);
      testing::Message::~Message((Message *)0x3adfb1);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x3ae009);
    if (local_14 == 0) {
      local_2a4 = 0;
      testing::internal::EqHelper<true>::Compare<int,unsigned_char>
                ((char *)CONCAT17(in_stack_fffffffffffff80f,in_stack_fffffffffffff808),
                 in_stack_fffffffffffff800,in_stack_fffffffffffff7f8,(uchar *)piVar8,ppcVar6);
      bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_2a0);
      if (!bVar1) {
        testing::Message::Message(&local_2b0);
        pcVar5 = testing::AssertionResult::failure_message((AssertionResult *)0x3ae0c9);
        testing::internal::AssertHelper::AssertHelper
                  (&local_2b8,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/capi/test_cfdcapi_script.cpp"
                   ,0x21e,pcVar5);
        testing::internal::AssertHelper::operator=(&local_2b8,&local_2b0);
        testing::internal::AssertHelper::~AssertHelper(&local_2b8);
        testing::Message::~Message((Message *)0x3ae12c);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)0x3ae181);
      local_2cc = 0xc0;
      testing::internal::EqHelper<false>::Compare<int,unsigned_char>
                ((char *)CONCAT17(in_stack_fffffffffffff80f,in_stack_fffffffffffff808),
                 in_stack_fffffffffffff800,in_stack_fffffffffffff7f8,(uchar *)piVar8);
      bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_2c8);
      if (!bVar1) {
        testing::Message::Message(&local_2d8);
        pcVar5 = testing::AssertionResult::failure_message((AssertionResult *)0x3ae22e);
        testing::internal::AssertHelper::AssertHelper
                  (&local_2e0,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/capi/test_cfdcapi_script.cpp"
                   ,0x21f,pcVar5);
        testing::internal::AssertHelper::operator=(&local_2e0,&local_2d8);
        testing::internal::AssertHelper::~AssertHelper(&local_2e0);
        testing::Message::~Message((Message *)0x3ae291);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)0x3ae2e6);
      testing::internal::CmpHelperSTREQ
                ((internal *)&local_2f0,
                 "\"e47f58011f27e9046b8195d0ab6a2acbc68ce281437a8d5132dadf389b2a5ebb\"",
                 "branch_hash","e47f58011f27e9046b8195d0ab6a2acbc68ce281437a8d5132dadf389b2a5ebb",
                 local_1a8);
      bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_2f0);
      if (!bVar1) {
        testing::Message::Message(&local_2f8);
        pcVar5 = testing::AssertionResult::failure_message((AssertionResult *)0x3ae387);
        testing::internal::AssertHelper::AssertHelper
                  (&local_300,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/capi/test_cfdcapi_script.cpp"
                   ,0x222,pcVar5);
        testing::internal::AssertHelper::operator=(&local_300,&local_2f8);
        testing::internal::AssertHelper::~AssertHelper(&local_300);
        testing::Message::~Message((Message *)0x3ae3ea);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)0x3ae43f);
      testing::internal::CmpHelperSTREQ
                ((internal *)&local_310,
                 "\"2057bf643684f6c5c75e1cdf45990036502a0d897394013210858cdabcbb95a05aad205bec1a08fa3443176edd0a08e2a64642f45e57543b62bffe43ec350edc33dc22ac\""
                 ,"tapscript",
                 "2057bf643684f6c5c75e1cdf45990036502a0d897394013210858cdabcbb95a05aad205bec1a08fa3443176edd0a08e2a64642f45e57543b62bffe43ec350edc33dc22ac"
                 ,local_1b0);
      bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_310);
      if (!bVar1) {
        testing::Message::Message(&local_318);
        pcVar5 = testing::AssertionResult::failure_message((AssertionResult *)0x3ae4e0);
        testing::internal::AssertHelper::AssertHelper
                  (&local_320,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/capi/test_cfdcapi_script.cpp"
                   ,0x225,pcVar5);
        testing::internal::AssertHelper::operator=(&local_320,&local_318);
        testing::internal::AssertHelper::~AssertHelper(&local_320);
        testing::Message::~Message((Message *)0x3ae543);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)0x3ae598);
      CfdFreeStringBuffer((char *)in_stack_fffffffffffff7f8);
      local_1a8 = (char *)0x0;
      CfdFreeStringBuffer((char *)in_stack_fffffffffffff7f8);
      local_1b0 = (char *)0x0;
    }
    in_stack_fffffffffffff7f0 = (AssertionResult *)local_199;
    ptVar7 = (type *)0x0;
    local_14 = CfdGetTapBranchData(in_stack_fffffffffffffa98,
                                   (void *)CONCAT17(uVar3,in_stack_fffffffffffffa90),
                                   (uint8_t)((ulong)this_01 >> 0x38),SUB81((ulong)this_01 >> 0x30,0)
                                   ,in_stack_fffffffffffffa80,
                                   (uint8_t *)CONCAT17(uVar4,in_stack_fffffffffffffa78),
                                   (char **)pAVar9,
                                   (uint8_t *)CONCAT17(uVar2,in_stack_fffffffffffffab8));
    local_334 = 0;
    testing::internal::EqHelper<false>::Compare<CfdErrorCode,int>
              ((char *)CONCAT17(in_stack_fffffffffffff80f,in_stack_fffffffffffff808),
               in_stack_fffffffffffff800,in_stack_fffffffffffff7f8,(int *)in_stack_fffffffffffff7f0)
    ;
    bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_330);
    if (!bVar1) {
      testing::Message::Message(&local_340);
      pcVar5 = testing::AssertionResult::failure_message((AssertionResult *)0x3ae6bf);
      testing::internal::AssertHelper::AssertHelper
                (&local_348,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/capi/test_cfdcapi_script.cpp"
                 ,0x22e,pcVar5);
      testing::internal::AssertHelper::operator=(&local_348,&local_340);
      testing::internal::AssertHelper::~AssertHelper(&local_348);
      testing::Message::~Message((Message *)0x3ae722);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x3ae77a);
    if (local_14 == 0) {
      local_35c = 0;
      testing::internal::EqHelper<true>::Compare<int,unsigned_char>
                ((char *)CONCAT17(in_stack_fffffffffffff80f,in_stack_fffffffffffff808),
                 in_stack_fffffffffffff800,in_stack_fffffffffffff7f8,
                 &in_stack_fffffffffffff7f0->success_,ptVar7);
      bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_358);
      if (!bVar1) {
        testing::Message::Message(&local_368);
        pcVar5 = testing::AssertionResult::failure_message((AssertionResult *)0x3ae83a);
        testing::internal::AssertHelper::AssertHelper
                  (&local_370,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/capi/test_cfdcapi_script.cpp"
                   ,0x230,pcVar5);
        testing::internal::AssertHelper::operator=(&local_370,&local_368);
        testing::internal::AssertHelper::~AssertHelper(&local_370);
        testing::Message::~Message((Message *)0x3ae89d);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)0x3ae8f2);
      testing::internal::CmpHelperSTREQ
                ((internal *)&local_380,
                 "\"a625d1251a1100263fa9a77b81e9e6f46c2eb8d44b9f27b629875cc102efb0ec\"",
                 "branch_hash","a625d1251a1100263fa9a77b81e9e6f46c2eb8d44b9f27b629875cc102efb0ec",
                 local_1a8);
      bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_380);
      if (!bVar1) {
        testing::Message::Message(&local_388);
        in_stack_fffffffffffff8e8 =
             testing::AssertionResult::failure_message((AssertionResult *)0x3ae993);
        testing::internal::AssertHelper::AssertHelper
                  (&local_390,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/capi/test_cfdcapi_script.cpp"
                   ,0x233,in_stack_fffffffffffff8e8);
        testing::internal::AssertHelper::operator=(&local_390,&local_388);
        testing::internal::AssertHelper::~AssertHelper(&local_390);
        testing::Message::~Message((Message *)0x3ae9f6);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)0x3aea4b);
      CfdFreeStringBuffer((char *)in_stack_fffffffffffff7f8);
      local_1a8 = (char *)0x0;
    }
    local_398 = (char *)0x0;
    local_3a0 = (char *)0x0;
    local_3a8 = (char *)0x0;
    local_14 = CfdGetTaprootScriptTreeHash
                         (in_stack_fffffffffffffa98,
                          (void *)CONCAT17(uVar3,in_stack_fffffffffffffa90),&this_01->success_,
                          in_stack_fffffffffffffa80,
                          (char **)CONCAT17(uVar4,in_stack_fffffffffffffa78),(char **)this_00);
    local_3bc = 0;
    pAVar9 = &local_3b8;
    testing::internal::EqHelper<false>::Compare<CfdErrorCode,int>
              ((char *)CONCAT17(in_stack_fffffffffffff80f,in_stack_fffffffffffff808),
               in_stack_fffffffffffff800,in_stack_fffffffffffff7f8,(int *)in_stack_fffffffffffff7f0)
    ;
    uVar2 = testing::AssertionResult::operator_cast_to_bool(pAVar9);
    if (!(bool)uVar2) {
      testing::Message::Message(&local_3c8);
      pcVar5 = testing::AssertionResult::failure_message((AssertionResult *)0x3aeb72);
      testing::internal::AssertHelper::AssertHelper
                (&local_3d0,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/capi/test_cfdcapi_script.cpp"
                 ,0x240,pcVar5);
      testing::internal::AssertHelper::operator=(&local_3d0,&local_3c8);
      testing::internal::AssertHelper::~AssertHelper(&local_3d0);
      testing::Message::~Message((Message *)0x3aebd5);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x3aec2a);
    if (local_14 == 0) {
      testing::internal::CmpHelperSTREQ
                ((internal *)&local_3e0,
                 "\"083a2209e2f0dc07e362bc1dfe195ed974f176358bc986d7c45b48d4deb363f7\"",
                 "witness_program",
                 "083a2209e2f0dc07e362bc1dfe195ed974f176358bc986d7c45b48d4deb363f7",local_398);
      bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_3e0);
      if (!bVar1) {
        testing::Message::Message(&local_3e8);
        pcVar5 = testing::AssertionResult::failure_message((AssertionResult *)0x3aecd9);
        testing::internal::AssertHelper::AssertHelper
                  (&local_3f0,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/capi/test_cfdcapi_script.cpp"
                   ,0x244,pcVar5);
        testing::internal::AssertHelper::operator=(&local_3f0,&local_3e8);
        testing::internal::AssertHelper::~AssertHelper(&local_3f0);
        testing::Message::~Message((Message *)0x3aed3c);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)0x3aed91);
      in_stack_fffffffffffff8a8 = &local_400;
      testing::internal::CmpHelperSTREQ
                ((internal *)in_stack_fffffffffffff8a8,
                 "\"4691fbb1196f4675241c8958a7ab6378a63aa0cc008ed03d216fd038357f52fd\"","leaf_hash",
                 "4691fbb1196f4675241c8958a7ab6378a63aa0cc008ed03d216fd038357f52fd",local_3a0);
      bVar1 = testing::AssertionResult::operator_cast_to_bool(in_stack_fffffffffffff8a8);
      if (!bVar1) {
        testing::Message::Message(&local_408);
        in_stack_fffffffffffff8a0 =
             testing::AssertionResult::failure_message((AssertionResult *)0x3aee32);
        testing::internal::AssertHelper::AssertHelper
                  (&local_410,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/capi/test_cfdcapi_script.cpp"
                   ,0x247,in_stack_fffffffffffff8a0);
        testing::internal::AssertHelper::operator=(&local_410,&local_408);
        testing::internal::AssertHelper::~AssertHelper(&local_410);
        testing::Message::~Message((Message *)0x3aee95);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)0x3aeeea);
      testing::internal::CmpHelperSTREQ
                ((internal *)&local_420,
                 "\"c11777701648fa4dd93c74edd9d58cfcc7bdc2fa30a2f6fa908b6fd70c92833cfba85b2107f791b26a84e7586c28cec7cb61202ed3d01944d832500f363782d675e47f58011f27e9046b8195d0ab6a2acbc68ce281437a8d5132dadf389b2a5ebb\""
                 ,"control_block",
                 "c11777701648fa4dd93c74edd9d58cfcc7bdc2fa30a2f6fa908b6fd70c92833cfba85b2107f791b26a84e7586c28cec7cb61202ed3d01944d832500f363782d675e47f58011f27e9046b8195d0ab6a2acbc68ce281437a8d5132dadf389b2a5ebb"
                 ,local_3a8);
      bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_420);
      if (!bVar1) {
        testing::Message::Message(&local_428);
        in_stack_fffffffffffff888 =
             testing::AssertionResult::failure_message((AssertionResult *)0x3aef8b);
        testing::internal::AssertHelper::AssertHelper
                  (&local_430,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/capi/test_cfdcapi_script.cpp"
                   ,0x24a,in_stack_fffffffffffff888);
        testing::internal::AssertHelper::operator=(&local_430,&local_428);
        testing::internal::AssertHelper::~AssertHelper(&local_430);
        testing::Message::~Message((Message *)0x3aefee);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)0x3af043);
      CfdFreeStringBuffer((char *)in_stack_fffffffffffff7f8);
      local_398 = (char *)0x0;
      CfdFreeStringBuffer((char *)in_stack_fffffffffffff7f8);
      local_3a0 = (char *)0x0;
      CfdFreeStringBuffer((char *)in_stack_fffffffffffff7f8);
      local_3a8 = (char *)0x0;
    }
    local_438 = (char *)0x0;
    local_14 = CfdGetTaprootScriptTreeSrting
                         (in_stack_fffffffffffff8e8,
                          (void *)CONCAT17(uVar2,in_stack_fffffffffffff8e0),(char **)pAVar9);
    local_44c = 0;
    testing::internal::EqHelper<false>::Compare<CfdErrorCode,int>
              ((char *)CONCAT17(in_stack_fffffffffffff80f,in_stack_fffffffffffff808),
               in_stack_fffffffffffff800,in_stack_fffffffffffff7f8,(int *)in_stack_fffffffffffff7f0)
    ;
    in_stack_fffffffffffff887 = testing::AssertionResult::operator_cast_to_bool(&local_448);
    if (!(bool)in_stack_fffffffffffff887) {
      testing::Message::Message(&local_458);
      pcVar5 = testing::AssertionResult::failure_message((AssertionResult *)0x3af16d);
      testing::internal::AssertHelper::AssertHelper
                (&local_460,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/capi/test_cfdcapi_script.cpp"
                 ,0x255,pcVar5);
      testing::internal::AssertHelper::operator=(&local_460,&local_458);
      testing::internal::AssertHelper::~AssertHelper(&local_460);
      testing::Message::~Message((Message *)0x3af1d0);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x3af225);
    if (local_14 == 0) {
      testing::internal::CmpHelperSTREQ
                ((internal *)&local_470,
                 "\"{{tl(20ac52f50b28cdd4d3bcb7f0d5cb533f232e4c4ef12fbf3e718420b84d4e3c3440ac),tl(51)},tl(2057bf643684f6c5c75e1cdf45990036502a0d897394013210858cdabcbb95a05aad205bec1a08fa3443176edd0a08e2a64642f45e57543b62bffe43ec350edc33dc22ac)}\""
                 ,"tree_str",
                 "{{tl(20ac52f50b28cdd4d3bcb7f0d5cb533f232e4c4ef12fbf3e718420b84d4e3c3440ac),tl(51)},tl(2057bf643684f6c5c75e1cdf45990036502a0d897394013210858cdabcbb95a05aad205bec1a08fa3443176edd0a08e2a64642f45e57543b62bffe43ec350edc33dc22ac)}"
                 ,local_438);
      bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_470);
      if (!bVar1) {
        testing::Message::Message(&local_478);
        pcVar5 = testing::AssertionResult::failure_message((AssertionResult *)0x3af2ce);
        testing::internal::AssertHelper::AssertHelper
                  (&local_480,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/capi/test_cfdcapi_script.cpp"
                   ,0x259,pcVar5);
        testing::internal::AssertHelper::operator=(&local_480,&local_478);
        testing::internal::AssertHelper::~AssertHelper(&local_480);
        testing::Message::~Message((Message *)0x3af32b);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)0x3af380);
      CfdFreeStringBuffer((char *)in_stack_fffffffffffff7f8);
      local_438 = (char *)0x0;
    }
    local_484 = CfdFreeTaprootScriptTreeHandle(in_stack_fffffffffffff8a8,in_stack_fffffffffffff8a0);
    local_49c = 0;
    testing::internal::EqHelper<false>::Compare<CfdErrorCode,int>
              ((char *)CONCAT17(in_stack_fffffffffffff80f,in_stack_fffffffffffff808),
               in_stack_fffffffffffff800,in_stack_fffffffffffff7f8,(int *)in_stack_fffffffffffff7f0)
    ;
    bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_498);
    if (!bVar1) {
      testing::Message::Message(&local_4a8);
      pcVar5 = testing::AssertionResult::failure_message((AssertionResult *)0x3af458);
      testing::internal::AssertHelper::AssertHelper
                (&local_4b0,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/capi/test_cfdcapi_script.cpp"
                 ,0x25f,pcVar5);
      testing::internal::AssertHelper::operator=(&local_4b0,&local_4a8);
      testing::internal::AssertHelper::~AssertHelper(&local_4b0);
      testing::Message::~Message((Message *)0x3af4b5);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x3af50a);
  }
  local_14 = CfdGetLastErrorCode(in_stack_fffffffffffff828);
  if (local_14 != 0) {
    local_4b8 = (char *)0x0;
    local_14 = CfdGetLastErrorMessage
                         (in_stack_fffffffffffff888,
                          (char **)CONCAT17(in_stack_fffffffffffff887,in_stack_fffffffffffff880));
    local_4cc = 0;
    testing::internal::EqHelper<false>::Compare<CfdErrorCode,int>
              ((char *)CONCAT17(in_stack_fffffffffffff80f,in_stack_fffffffffffff808),
               in_stack_fffffffffffff800,in_stack_fffffffffffff7f8,(int *)in_stack_fffffffffffff7f0)
    ;
    bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_4c8);
    if (!bVar1) {
      testing::Message::Message(&local_4d8);
      pcVar5 = testing::AssertionResult::failure_message((AssertionResult *)0x3af5f7);
      testing::internal::AssertHelper::AssertHelper
                (&local_4e0,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/capi/test_cfdcapi_script.cpp"
                 ,0x266,pcVar5);
      testing::internal::AssertHelper::operator=(&local_4e0,&local_4d8);
      testing::internal::AssertHelper::~AssertHelper(&local_4e0);
      testing::Message::~Message((Message *)0x3af654);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x3af6a9);
    testing::internal::CmpHelperSTREQ((internal *)&local_4f0,"\"\"","str_buffer","",local_4b8);
    bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_4f0);
    if (!bVar1) {
      testing::Message::Message(&local_4f8);
      pcVar5 = testing::AssertionResult::failure_message((AssertionResult *)0x3af73e);
      testing::internal::AssertHelper::AssertHelper
                (&local_500,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/capi/test_cfdcapi_script.cpp"
                 ,0x267,pcVar5);
      testing::internal::AssertHelper::operator=(&local_500,&local_4f8);
      testing::internal::AssertHelper::~AssertHelper(&local_500);
      testing::Message::~Message((Message *)0x3af79b);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x3af7f0);
    CfdFreeStringBuffer((char *)in_stack_fffffffffffff7f8);
    local_4b8 = (char *)0x0;
  }
  local_14 = CfdFreeHandle(in_stack_fffffffffffff7f8);
  local_514 = 0;
  pAVar9 = &local_510;
  testing::internal::EqHelper<false>::Compare<CfdErrorCode,int>
            ((char *)CONCAT17(in_stack_fffffffffffff80f,in_stack_fffffffffffff808),&pAVar9->success_
             ,in_stack_fffffffffffff7f8,(int *)in_stack_fffffffffffff7f0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(pAVar9);
  if (!bVar1) {
    testing::Message::Message(&local_520);
    pcVar5 = testing::AssertionResult::failure_message((AssertionResult *)0x3af8c0);
    testing::internal::AssertHelper::AssertHelper
              (&local_528,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/capi/test_cfdcapi_script.cpp"
               ,0x26d,pcVar5);
    testing::internal::AssertHelper::operator=(&local_528,&local_520);
    testing::internal::AssertHelper::~AssertHelper(&local_528);
    testing::Message::~Message((Message *)0x3af91d);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x3af972);
  return;
}

Assistant:

TEST(cfdcapi_script, TapscriptTreeAddTree1) {
  void* handle = NULL;
  int ret = CfdCreateHandle(&handle);
  EXPECT_EQ(kCfdSuccess, ret);
  EXPECT_FALSE((NULL == handle));

  void* tree_handle = nullptr;
  ret = CfdInitializeTaprootScriptTree(handle, &tree_handle);
  EXPECT_EQ(kCfdSuccess, ret);
  if (ret == kCfdSuccess) {
    ret = CfdSetInitialTapLeaf(handle, tree_handle,
        "20ac52f50b28cdd4d3bcb7f0d5cb533f232e4c4ef12fbf3e718420b84d4e3c3440ac",
        0xc0);
    EXPECT_EQ(kCfdSuccess, ret);

    ret = CfdAddTapBranchByTapLeaf(handle, tree_handle,
        "51",
        0xc0);
    EXPECT_EQ(kCfdSuccess, ret);

    ret = CfdAddTapBranchByTapLeaf(handle, tree_handle,
        "2057bf643684f6c5c75e1cdf45990036502a0d897394013210858cdabcbb95a05aad205bec1a08fa3443176edd0a08e2a64642f45e57543b62bffe43ec350edc33dc22ac",
        0xc0);
    EXPECT_EQ(kCfdSuccess, ret);

    uint32_t branch_count = 0;
    ret = CfdGetTapBranchCount(handle, tree_handle, &branch_count);
    EXPECT_EQ(kCfdSuccess, ret);
    EXPECT_EQ(2, branch_count);

    uint8_t depth = 0;
    uint8_t leaf_version = 0;
    char* branch_hash = nullptr;
    char* tapscript = nullptr;
    ret = CfdGetTapBranchData(handle, tree_handle,
        0, false, &branch_hash, &leaf_version, &tapscript, &depth);
    EXPECT_EQ(kCfdSuccess, ret);
    if (ret == kCfdSuccess) {
      EXPECT_EQ(0, depth);
      EXPECT_EQ(0xc0, leaf_version);
      EXPECT_STREQ(
        "a85b2107f791b26a84e7586c28cec7cb61202ed3d01944d832500f363782d675",
        branch_hash);
      EXPECT_STREQ(
        "51",
        tapscript);
      CfdFreeStringBuffer(branch_hash);
      branch_hash = nullptr;
      CfdFreeStringBuffer(tapscript);
      tapscript = nullptr;
    }

    ret = CfdGetTapBranchData(handle, tree_handle,
        1, false, &branch_hash, &leaf_version, &tapscript, &depth);
    EXPECT_EQ(kCfdSuccess, ret);
    if (ret == kCfdSuccess) {
      EXPECT_EQ(0, depth);
      EXPECT_EQ(0xc0, leaf_version);
      EXPECT_STREQ(
        "e47f58011f27e9046b8195d0ab6a2acbc68ce281437a8d5132dadf389b2a5ebb",
        branch_hash);
      EXPECT_STREQ(
        "2057bf643684f6c5c75e1cdf45990036502a0d897394013210858cdabcbb95a05aad205bec1a08fa3443176edd0a08e2a64642f45e57543b62bffe43ec350edc33dc22ac",
        tapscript);
      CfdFreeStringBuffer(branch_hash);
      branch_hash = nullptr;
      CfdFreeStringBuffer(tapscript);
      tapscript = nullptr;
    }

    ret = CfdGetTapBranchData(handle, tree_handle,
        1, true, &branch_hash, nullptr, nullptr, &depth);
    EXPECT_EQ(kCfdSuccess, ret);
    if (ret == kCfdSuccess) {
      EXPECT_EQ(0, depth);
      EXPECT_STREQ(
        "a625d1251a1100263fa9a77b81e9e6f46c2eb8d44b9f27b629875cc102efb0ec",
        branch_hash);
      CfdFreeStringBuffer(branch_hash);
      branch_hash = nullptr;
    }

    char* witness_program = nullptr;
    char* leaf_hash = nullptr;
    char* control_block = nullptr;
    ret = CfdGetTaprootScriptTreeHash(handle, tree_handle,
        "1777701648fa4dd93c74edd9d58cfcc7bdc2fa30a2f6fa908b6fd70c92833cfb",
        &witness_program,
        &leaf_hash,
        &control_block);
    EXPECT_EQ(kCfdSuccess, ret);
    if (ret == kCfdSuccess) {
      EXPECT_STREQ(
        "083a2209e2f0dc07e362bc1dfe195ed974f176358bc986d7c45b48d4deb363f7",
        witness_program);
      EXPECT_STREQ(
        "4691fbb1196f4675241c8958a7ab6378a63aa0cc008ed03d216fd038357f52fd",
        leaf_hash);
      EXPECT_STREQ(
        "c11777701648fa4dd93c74edd9d58cfcc7bdc2fa30a2f6fa908b6fd70c92833cfba85b2107f791b26a84e7586c28cec7cb61202ed3d01944d832500f363782d675e47f58011f27e9046b8195d0ab6a2acbc68ce281437a8d5132dadf389b2a5ebb",
        control_block);
      CfdFreeStringBuffer(witness_program);
      witness_program = nullptr;
      CfdFreeStringBuffer(leaf_hash);
      leaf_hash = nullptr;
      CfdFreeStringBuffer(control_block);
      control_block = nullptr;
    }

    char* tree_str = nullptr;
    ret = CfdGetTaprootScriptTreeSrting(handle, tree_handle, &tree_str);
    EXPECT_EQ(kCfdSuccess, ret);
    if (ret == kCfdSuccess) {
      EXPECT_STREQ(
        "{{tl(20ac52f50b28cdd4d3bcb7f0d5cb533f232e4c4ef12fbf3e718420b84d4e3c3440ac),tl(51)},tl(2057bf643684f6c5c75e1cdf45990036502a0d897394013210858cdabcbb95a05aad205bec1a08fa3443176edd0a08e2a64642f45e57543b62bffe43ec350edc33dc22ac)}",
        tree_str);
      CfdFreeStringBuffer(tree_str);
      tree_str = nullptr;
    }

    int tmp_ret = CfdFreeTaprootScriptTreeHandle(handle, tree_handle);
    EXPECT_EQ(kCfdSuccess, tmp_ret);
  }

  ret = CfdGetLastErrorCode(handle);
  if (ret != kCfdSuccess) {
    char* str_buffer = NULL;
    ret = CfdGetLastErrorMessage(handle, &str_buffer);
    EXPECT_EQ(kCfdSuccess, ret);
    EXPECT_STREQ("", str_buffer);
    CfdFreeStringBuffer(str_buffer);
    str_buffer = NULL;
  }

  ret = CfdFreeHandle(handle);
  EXPECT_EQ(kCfdSuccess, ret);
}